

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CasePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CasePropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PropertyCaseItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          SyntaxList<slang::syntax::PropertyCaseItemSyntax> *args_4,Token *args_5)

{
  size_t sVar1;
  pointer ppPVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  SyntaxNode *pSVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  undefined4 uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  CasePropertyExprSyntax *pCVar25;
  long lVar26;
  
  pCVar25 = (CasePropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CasePropertyExprSyntax *)this->endPtr < pCVar25 + 1) {
    pCVar25 = (CasePropertyExprSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pCVar25 + 1);
  }
  TVar8 = args->kind;
  uVar9 = args->field_0x2;
  NVar10.raw = (args->numFlags).raw;
  uVar11 = args->rawLen;
  pIVar3 = args->info;
  TVar12 = args_1->kind;
  uVar13 = args_1->field_0x2;
  NVar14.raw = (args_1->numFlags).raw;
  uVar15 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar16 = args_3->kind;
  uVar17 = args_3->field_0x2;
  NVar18.raw = (args_3->numFlags).raw;
  uVar19 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar21 = args_5->kind;
  uVar22 = args_5->field_0x2;
  NVar23.raw = (args_5->numFlags).raw;
  uVar24 = args_5->rawLen;
  pIVar6 = args_5->info;
  (pCVar25->super_PropertyExprSyntax).super_SyntaxNode.kind = CasePropertyExpr;
  (pCVar25->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar25->super_PropertyExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar25->caseKeyword).kind = TVar8;
  (pCVar25->caseKeyword).field_0x2 = uVar9;
  (pCVar25->caseKeyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (pCVar25->caseKeyword).rawLen = uVar11;
  (pCVar25->caseKeyword).info = pIVar3;
  (pCVar25->openParen).kind = TVar12;
  (pCVar25->openParen).field_0x2 = uVar13;
  (pCVar25->openParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pCVar25->openParen).rawLen = uVar15;
  (pCVar25->openParen).info = pIVar4;
  (pCVar25->expr).ptr = args_2;
  (pCVar25->closeParen).kind = TVar16;
  (pCVar25->closeParen).field_0x2 = uVar17;
  (pCVar25->closeParen).numFlags = (NumericTokenFlags)NVar18.raw;
  (pCVar25->closeParen).rawLen = uVar19;
  (pCVar25->closeParen).info = pIVar5;
  uVar20 = *(undefined4 *)&(args_4->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar7 = (args_4->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_4->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar25->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar20;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar7;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_4->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar25->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pCVar25->items).super_SyntaxListBase.childCount = (args_4->super_SyntaxListBase).childCount;
  sVar1 = (args_4->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pCVar25->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args_4->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).
           _M_ptr;
  (pCVar25->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (pCVar25->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a5250;
  (pCVar25->endcase).kind = TVar21;
  (pCVar25->endcase).field_0x2 = uVar22;
  (pCVar25->endcase).numFlags = (NumericTokenFlags)NVar23.raw;
  (pCVar25->endcase).rawLen = uVar24;
  (pCVar25->endcase).info = pIVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pCVar25;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar25;
  sVar1 = (pCVar25->items).
          super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppPVar2 = (pCVar25->items).
              super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar26 = 0;
    do {
      *(CasePropertyExprSyntax **)(*(long *)((long)ppPVar2 + lVar26) + 8) = pCVar25;
      lVar26 = lVar26 + 8;
    } while (sVar1 << 3 != lVar26);
  }
  return pCVar25;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }